

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O3

void __thiscall
Js::AsmJsFunctionDeclaration::SetArgCount(AsmJsFunctionDeclaration *this,ArgSlot count)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  AsmJsType *__s;
  size_t requestedBytes;
  
  if (this->mArgumentsType != (AsmJsType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1e9,"(mArgumentsType == nullptr)","mArgumentsType == nullptr");
    if (!bVar3) goto LAB_00954e46;
    *puVar5 = 0;
  }
  if (this->mArgCount != 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1ea,"(mArgCount == Constants::InvalidArgSlot)",
                                "mArgCount == Constants::InvalidArgSlot");
    if (!bVar3) goto LAB_00954e46;
    *puVar5 = 0;
  }
  if (count == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1eb,"(count != Constants::InvalidArgSlot)",
                                "count != Constants::InvalidArgSlot");
    if (!bVar3) goto LAB_00954e46;
    *puVar5 = 0;
    this->mArgCount = 0xffff;
  }
  else {
    this->mArgCount = count;
    if (count == 0) {
      return;
    }
  }
  this_00 = &this->mAllocator->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00954e46;
    *puVar5 = 0;
  }
  uVar2 = (ulong)count;
  requestedBytes = uVar2 * 4;
  __s = (AsmJsType *)
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                  (this_00,requestedBytes);
  memset(__s,0,requestedBytes);
  memset(__s + uVar2,0,(ulong)((int)requestedBytes + 0xfU & 0xfffffff0) + uVar2 * -4);
  if (__s == (AsmJsType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00954e46:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  memset(__s,0xff,requestedBytes);
  this->mArgumentsType = __s;
  return;
}

Assistant:

void AsmJsFunctionDeclaration::SetArgCount(ArgSlot count )
    {
        Assert( mArgumentsType == nullptr );
        Assert(mArgCount == Constants::InvalidArgSlot);
        Assert(count != Constants::InvalidArgSlot);
        mArgCount = count;
        if( count > 0 )
        {
            mArgumentsType = AnewArrayZ( mAllocator, AsmJsType, count );
        }
    }